

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O1

bool __thiscall
Opcode::AABBTreeOfAABBsBuilder::ComputeGlobalBox
          (AABBTreeOfAABBsBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  uint uVar1;
  AABB *pAVar2;
  undefined8 uVar3;
  AABB *pAVar4;
  float fVar5;
  ulong uVar6;
  
  if (nb_prims != 0 && primitives != (udword *)0x0) {
    pAVar2 = this->mAABBArray;
    uVar1 = *primitives;
    pAVar4 = pAVar2 + uVar1;
    fVar5 = (pAVar4->mExtents).z;
    (global_box->mExtents).y = (pAVar4->mExtents).y;
    (global_box->mExtents).z = fVar5;
    pAVar2 = pAVar2 + uVar1;
    fVar5 = (pAVar2->mCenter).y;
    uVar3 = *(undefined8 *)&(pAVar2->mCenter).z;
    (global_box->mCenter).x = (pAVar2->mCenter).x;
    (global_box->mCenter).y = fVar5;
    *(undefined8 *)&(global_box->mCenter).z = uVar3;
    if (1 < nb_prims) {
      uVar6 = 1;
      do {
        IceMaths::AABB::Add(global_box,this->mAABBArray + primitives[uVar6]);
        uVar6 = uVar6 + 1;
      } while (nb_prims != uVar6);
    }
  }
  return nb_prims != 0 && primitives != (udword *)0x0;
}

Assistant:

bool AABBTreeOfAABBsBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	global_box = mAABBArray[primitives[0]];

	// Loop through boxes
	for(udword i=1;i<nb_prims;i++)
	{
		// Update global box
		global_box.Add(mAABBArray[primitives[i]]);
	}
	return true;
}